

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint port_;
  ostream *poVar1;
  long lVar2;
  IpEndpointName local_4d0;
  undefined1 local_4c0 [8];
  UdpListeningReceiveSocket s;
  ProxyListener listener;
  uint local_58;
  uint proxyport;
  string local_48 [8];
  string proxyhost;
  uint listenport;
  char *endp;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  endp = (char *)argv;
  argv_local._0_4_ = argc;
  if (argc < 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"OscProxy listenport [proxyhost proxyport]");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
  }
  else {
    lVar2 = strtol(argv[1],(char **)&stack0xffffffffffffffe0,10);
    port_ = (uint)lVar2;
    std::__cxx11::string::string(local_48);
    if (2 < (int)argv_local) {
      std::__cxx11::string::operator=(local_48,*(char **)(endp + 0x10));
    }
    local_58 = port_;
    if (3 < (int)argv_local) {
      lVar2 = strtol(*(char **)(endp + 0x18),(char **)&stack0xffffffffffffffe0,10);
      local_58 = (uint)lVar2;
    }
    if (port_ == 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"invalid listenport");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
    }
    else if (local_58 == 0) {
      poVar1 = std::operator<<((ostream *)&std::cerr,"invalid proxyport");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = -1;
    }
    else {
      ProxyListener::ProxyListener((ProxyListener *)&s.listener_,(string *)local_48,local_58);
      IpEndpointName::IpEndpointName(&local_4d0,0xffffffff,port_);
      UdpListeningReceiveSocket::UdpListeningReceiveSocket
                ((UdpListeningReceiveSocket *)local_4c0,&local_4d0,(PacketListener *)&s.listener_);
      poVar1 = std::operator<<((ostream *)&std::cout,"press ctrl-c to end");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      UdpListeningReceiveSocket::RunUntilSigInt((UdpListeningReceiveSocket *)local_4c0);
      argv_local._4_4_ = 0;
      UdpListeningReceiveSocket::~UdpListeningReceiveSocket((UdpListeningReceiveSocket *)local_4c0);
      ProxyListener::~ProxyListener((ProxyListener *)&s.listener_);
    }
    std::__cxx11::string::~string(local_48);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
    (void) argc; // suppress unused parameter warnings
    (void) argv; // suppress unused parameter warnings
    if (argc < 2) {
        std::cerr << "OscProxy listenport [proxyhost proxyport]" << std::endl;
        return -1;
    }
    char *endp;
    auto listenport = (unsigned) std::strtol(argv[1], &endp, 10);

    std::string proxyhost;
    if (argc > 2) proxyhost = argv[2];

    unsigned proxyport = listenport;
    if (argc > 3) proxyport =  (unsigned) std::strtol(argv[3], &endp, 10);

    if (listenport == 0) {
        std::cerr << "invalid listenport" << std::endl;
        return -1;
    }

    if (proxyport == 0) {
        std::cerr << "invalid proxyport" << std::endl;
        return -1;
    }

    ProxyListener listener(proxyhost, proxyport);

    UdpListeningReceiveSocket s(
            IpEndpointName(IpEndpointName::ANY_ADDRESS, listenport),
            &listener);

    std::cout << "press ctrl-c to end" << std::endl;

    s.RunUntilSigInt();

    return 0;
}